

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixCase::ShaderMatrixCase
          (ShaderMatrixCase *this,TestContext *testCtx,string *name,string *desc,ShaderInput *in0,
          ShaderInput *in1,MatrixOp op,bool isVertexCase)

{
  InputType IVar1;
  InputType IVar2;
  DataType DVar3;
  ShaderEvaluator *this_00;
  _func_int **local_50;
  
  this_00 = (ShaderEvaluator *)operator_new(0x20);
  DVar3 = in0->dataType << 7 | op << 0xe | in1->dataType;
  switch(DVar3) {
  case 0x8281:
    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_5,_1>::evaluate;
    break;
  case 0x8282:
    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_5,_2>::evaluate;
    break;
  case 0x8283:
  case 0x8284:
  case 0x8286:
  case 0x8287:
  case 0x8289:
  case 0x828a:
    goto switchD_005a8736_caseD_8685;
  case 0x8285:
    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_5,_5>::evaluate;
    break;
  case 0x8288:
    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_5,_8>::evaluate;
    break;
  case 0x828b:
    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_5,_11>::evaluate;
    break;
  default:
    switch(DVar3) {
    case 0x8301:
      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_6,_1>::evaluate;
      break;
    case 0x8302:
      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_6,_2>::evaluate;
      break;
    case 0x8303:
    case 0x8304:
    case 0x8306:
    case 0x8307:
    case 0x8309:
    case 0x830a:
      goto switchD_005a8736_caseD_8685;
    case 0x8305:
      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_6,_5>::evaluate;
      break;
    case 0x8308:
      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_6,_8>::evaluate;
      break;
    case 0x830b:
      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_6,_11>::evaluate;
      break;
    default:
      switch(DVar3) {
      case 0x8381:
        local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_7,_1>::evaluate;
        break;
      case 0x8382:
        local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_7,_2>::evaluate;
        break;
      case 0x8383:
      case 0x8384:
      case 0x8386:
      case 0x8387:
      case 0x8389:
      case 0x838a:
        goto switchD_005a8736_caseD_8685;
      case 0x8385:
        local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_7,_5>::evaluate;
        break;
      case 0x8388:
        local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_7,_8>::evaluate;
        break;
      case 0x838b:
        local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_7,_11>::evaluate;
        break;
      default:
        switch(DVar3) {
        case 0x8401:
          local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_8,_1>::evaluate;
          break;
        case 0x8402:
        case 0x8404:
        case 0x8405:
        case 0x8407:
        case 0x8408:
        case 0x840a:
        case 0x840b:
          goto switchD_005a8736_caseD_8685;
        case 0x8403:
          local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_8,_3>::evaluate;
          break;
        case 0x8406:
          local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_8,_6>::evaluate;
          break;
        case 0x8409:
          local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_8,_9>::evaluate;
          break;
        case 0x840c:
          local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_8,_12>::evaluate;
          break;
        default:
          switch(DVar3) {
          case 0x8481:
            local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_9,_1>::evaluate;
            break;
          case 0x8482:
          case 0x8484:
          case 0x8485:
          case 0x8487:
          case 0x8488:
          case 0x848a:
          case 0x848b:
            goto switchD_005a8736_caseD_8685;
          case 0x8483:
            local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_9,_3>::evaluate;
            break;
          case 0x8486:
            local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_9,_6>::evaluate;
            break;
          case 0x8489:
            local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_9,_9>::evaluate;
            break;
          case 0x848c:
            local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_9,_12>::evaluate;
            break;
          default:
            switch(DVar3) {
            case 0x8501:
              local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_10,_1>::evaluate;
              break;
            case 0x8502:
            case 0x8504:
            case 0x8505:
            case 0x8507:
            case 0x8508:
            case 0x850a:
            case 0x850b:
              goto switchD_005a8736_caseD_8685;
            case 0x8503:
              local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_10,_3>::evaluate;
              break;
            case 0x8506:
              local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_10,_6>::evaluate;
              break;
            case 0x8509:
              local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_10,_9>::evaluate;
              break;
            case 0x850c:
              local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_10,_12>::evaluate;
              break;
            default:
              switch(DVar3) {
              case 0x8584:
                local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_11,_4>::evaluate;
                break;
              case 0x8585:
              case 0x8586:
              case 0x8588:
              case 0x8589:
              case 0x858b:
              case 0x858c:
                goto switchD_005a8736_caseD_8685;
              case 0x8587:
                local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_11,_7>::evaluate;
                break;
              case 0x858a:
                local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_11,_10>::evaluate;
                break;
              case 0x858d:
                local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_11,_13>::evaluate;
                break;
              default:
                switch(DVar3) {
                case 0x8604:
                  local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_12,_4>::evaluate;
                  break;
                case 0x8605:
                case 0x8606:
                case 0x8608:
                case 0x8609:
                case 0x860b:
                case 0x860c:
                  goto switchD_005a8736_caseD_8685;
                case 0x8607:
                  local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_12,_7>::evaluate;
                  break;
                case 0x860a:
                  local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_12,_10>::evaluate;
                  break;
                case 0x860d:
                  local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_12,_13>::evaluate;
                  break;
                default:
                  switch(DVar3) {
                  case 0x8684:
                    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_13,_4>::evaluate;
                    break;
                  case 0x8687:
                    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_13,_7>::evaluate;
                    break;
                  case 0x868a:
                    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_13,_10>::evaluate;
                    break;
                  case 0x868d:
                    local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_13,_13>::evaluate;
                    break;
                  default:
                    if (DVar3 == 0x281) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_5,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x301) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_6,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x381) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_7,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x401) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_8,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x481) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_9,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x501) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_10,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x50a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x581) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_11,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x58b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x601) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_12,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x60c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x681) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_13,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x68d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<0,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4868d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4301) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_6,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4381) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_7,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4401) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_8,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4481) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_9,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4501) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_10,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x450a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4581) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_11,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x458b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4601) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_12,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x460c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4681) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_13,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x468d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8105) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_2,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8108) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_2,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x810b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_2,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8186) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_3,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8189) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_3,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x818c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_3,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8207) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_4,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x820a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_4,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x820d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_4,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8581) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_11,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8601) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_12,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x8681) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<2,_13,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc281) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_5,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc301) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_6,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc381) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_7,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc401) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_8,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc481) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_9,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc501) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_10,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc50a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc581) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_11,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc58b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc601) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_12,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc60c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc681) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_13,_1>::evaluate;
                      break;
                    }
                    if (DVar3 == 0xc68d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<3,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x10285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x10306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x10387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x10408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x10489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1050a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1058b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1060c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1068d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<4,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14102) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14103) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14104) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_2,_4>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14182) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_3,_2>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14183) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_3,_3>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14184) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_3,_4>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14202) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_4,_2>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14203) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_4,_3>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x14204) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x182de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1835e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x183de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1845e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x184de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1855e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x185de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1865e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x186de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<6,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1c2de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<7,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1c4de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<7,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x1c6de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<7,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x202de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<8,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x204de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<8,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x206de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<8,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x242de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2435e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x243de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2445e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x244de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2455e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x245de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2465e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x246de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<9,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x282de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2835e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x283de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2845e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x284de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2855e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x285de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2865e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x286de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<10,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c2de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c35e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c3de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c45e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c4de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c55e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c5de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c65e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x2c6de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<11,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x302de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3035e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x303de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3045e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x304de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3055e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x305de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3065e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x306de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<12,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x342de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3435e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x343de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3445e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x344de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3455e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x345de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3465e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x346de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<13,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x382de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_5,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3835e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_6,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x383de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_7,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3845e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_8,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x384de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_9,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3855e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_10,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x385de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_11,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3865e) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_12,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x386de) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<14,_13,_94>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c50a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c58b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c60c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x3c68d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<15,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x40285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x40306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x40387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x40408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x40489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4050a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4058b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4060c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4068d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<16,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x44285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<17,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x44489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<17,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4468d) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<17,_13,_13>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x48285) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_5,_5>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x48306) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_6,_6>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x48387) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_7,_7>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x48408) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_8,_8>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x48489) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_9,_9>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4850a) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_10,_10>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4858b) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_11,_11>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4860c) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<18,_12,_12>::evaluate;
                      break;
                    }
                    if (DVar3 == 0x4281) {
                      local_50 = (_func_int **)MatrixCaseUtils::Evaluator<1,_5,_1>::evaluate;
                      break;
                    }
                  case 0x8685:
                  case 0x8686:
                  case 0x8688:
                  case 0x8689:
                  case 0x868b:
                  case 0x868c:
switchD_005a8736_caseD_8685:
                    local_50 = (_func_int **)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  IVar1 = in0->inputType;
  IVar2 = in1->inputType;
  ShaderEvaluator::ShaderEvaluator(this_00);
  this_00->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00bffa68;
  this_00[1]._vptr_ShaderEvaluator = local_50;
  *(InputType *)&this_00[1].m_evalFunc = IVar1;
  *(InputType *)((long)&this_00[1].m_evalFunc + 4) = IVar2;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,desc,isVertexCase,this_00,
             (UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00bffa08;
  DVar3 = in0->dataType;
  (this->m_in0).inputType = in0->inputType;
  (this->m_in0).dataType = DVar3;
  (this->m_in0).precision = in0->precision;
  DVar3 = in1->dataType;
  (this->m_in1).inputType = in1->inputType;
  (this->m_in1).dataType = DVar3;
  (this->m_in1).precision = in1->precision;
  this->m_op = op;
  setupShader(this);
  return;
}

Assistant:

ShaderMatrixCase::ShaderMatrixCase (tcu::TestContext&	testCtx,
									const std::string&	name,
									const std::string&	desc,
									const ShaderInput&	in0,
									const ShaderInput&	in1,
									MatrixOp			op,
									bool				isVertexCase)
	: ShaderRenderCase	(testCtx,
						 name,
						 desc,
						 isVertexCase,
						 new MatrixShaderEvaluator(getEvalFunc(in0, in1, op), in0.inputType, in1.inputType),
						 DE_NULL /* uniform setup */,
						 DE_NULL /* attribute setup */)
	, m_in0				(in0)
	, m_in1				(in1)
	, m_op				(op)
{
	setupShader();
}